

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  int iVar1;
  iterator iVar2;
  iterator iVar3;
  reference pvVar4;
  bool bVar5;
  int local_94;
  int cost;
  int k;
  int totalCost;
  int local_64;
  undefined1 local_60 [4];
  int j;
  vector<int,_std::allocator<int>_> evening;
  int i;
  undefined1 local_38 [8];
  vector<int,_std::allocator<int>_> morning;
  int local_18;
  int temp;
  int r;
  int d;
  int n;
  
  d = 0;
  while( true ) {
    iVar1 = __isoc99_scanf("%d %d %d",&r,&temp,&local_18);
    bVar5 = false;
    if (((iVar1 != 0) && (bVar5 = false, r != 0)) && (bVar5 = false, temp != 0)) {
      bVar5 = local_18 != 0;
    }
    if (!bVar5) break;
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_38);
    std::vector<int,_std::allocator<int>_>::reserve
              ((vector<int,_std::allocator<int>_> *)local_38,(ulong)(uint)r);
    for (evening.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._0_4_ = 0;
        (int)evening.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage < r;
        evening.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._0_4_ =
             (int)evening.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage + 1) {
      __isoc99_scanf("%d",(undefined1 *)
                          ((long)&morning.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage + 4));
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)local_38,
                 (value_type_conflict *)
                 ((long)&morning.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 4));
    }
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_60);
    std::vector<int,_std::allocator<int>_>::reserve
              ((vector<int,_std::allocator<int>_> *)local_60,(long)r);
    for (local_64 = 0; local_64 < r; local_64 = local_64 + 1) {
      __isoc99_scanf("%d",(undefined1 *)
                          ((long)&morning.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage + 4));
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)local_60,
                 (value_type_conflict *)
                 ((long)&morning.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 4));
    }
    iVar2 = std::vector<int,_std::allocator<int>_>::begin
                      ((vector<int,_std::allocator<int>_> *)local_38);
    iVar3 = std::vector<int,_std::allocator<int>_>::end
                      ((vector<int,_std::allocator<int>_> *)local_38);
    std::sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar2._M_current,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar3._M_current);
    iVar2 = std::vector<int,_std::allocator<int>_>::begin
                      ((vector<int,_std::allocator<int>_> *)local_60);
    iVar3 = std::vector<int,_std::allocator<int>_>::end
                      ((vector<int,_std::allocator<int>_> *)local_60);
    std::
    sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::greater<void>>
              (iVar2._M_current,iVar3._M_current);
    cost = 0;
    for (local_94 = 0; local_94 < r; local_94 = local_94 + 1) {
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_38,(long)local_94);
      iVar1 = *pvVar4;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_60,(long)local_94);
      if (temp < iVar1 + *pvVar4) {
        cost = ((iVar1 + *pvVar4) - temp) + cost;
      }
    }
    printf("%d\n",(ulong)(uint)(cost * local_18));
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_60);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_38);
  }
  return 0;
}

Assistant:

int main(){
    int n,d,r,temp;
    while (scanf("%d %d %d", &n, &d, &r) && n && d && r){
        vector<int> morning;
        morning.reserve(static_cast<unsigned int>(n));

        for (int i = 0; i < n; ++i) {
            scanf("%d",&temp);
            morning.push_back(temp);
        }
        vector<int> evening;
        evening.reserve(n);
        for (int j = 0; j < n; ++j) {
            scanf("%d",&temp);
            evening.push_back(temp);
        }

        sort(morning.begin(),morning.end());
        sort(evening.begin(),evening.end(), greater<>());
        int totalCost = 0;
        for (int k = 0; k < n; ++k) {
            int cost = morning[k] + evening[k];
            if (cost > d){
                totalCost += cost-d;
            }
        }
        totalCost *= r;
        printf("%d\n",totalCost);

    }
    return 0;
}